

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_sni_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  int iVar1;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  if (((*(ushort *)&hs->ssl->s3->field_0xdc >> 5 & 1) == 0) &&
     ((*(uint *)&hs->field_0x6c8 >> 8 & 1) != 0)) {
    iVar1 = CBB_add_u16(out,0);
    if ((iVar1 != 0) && (iVar1 = CBB_add_u16(out,0), iVar1 != 0)) {
      return true;
    }
    hs_local._7_1_ = false;
  }
  else {
    hs_local._7_1_ = true;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_sni_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  if (hs->ssl->s3->session_reused ||  //
      !hs->should_ack_sni) {
    return true;
  }

  if (!CBB_add_u16(out, TLSEXT_TYPE_server_name) ||
      !CBB_add_u16(out, 0 /* length */)) {
    return false;
  }

  return true;
}